

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_FillColumnP(void)

{
  int iVar1;
  BYTE BVar2;
  BYTE color;
  BYTE *pBStack_18;
  int pitch;
  BYTE *dest;
  int count;
  
  iVar1 = dc_pitch;
  dest._4_4_ = dc_count;
  if (0 < dc_count) {
    pBStack_18 = dc_dest;
    BVar2 = (BYTE)dc_color;
    do {
      *pBStack_18 = BVar2;
      pBStack_18 = pBStack_18 + iVar1;
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void R_FillColumnP (void)
{
	int 				count;
	BYTE*				dest;

	count = dc_count;

	if (count <= 0)
		return;

	dest = dc_dest;

	{
		int pitch = dc_pitch;
		BYTE color = dc_color;

		do
		{
			*dest = color;
			dest += pitch;
		} while (--count);
	}
}